

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_clock_constraint
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *first,typed_expression_t *second,ineq_cmp_t cmp,
          typed_expression_t *bound)

{
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> *this_00;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  clocks_compiler;
  ulong local_48;
  undefined **local_40;
  vector<long,_std::allocator<long>_> *local_38;
  
  this_00 = &this->_bytecode_back_inserter;
  local_38 = (this->_bytecode_back_inserter).container;
  local_40 = &PTR__typed_expression_visitor_t_0028eab0;
  (**(code **)(*(long *)first + 0x30))(first,&local_40);
  (**(code **)(*(long *)second + 0x30))(second,&local_40);
  (**(code **)(*(long *)bound + 0x30))(bound,this);
  local_48 = 0x16;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_48);
  local_48 = (ulong)cmp;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_48);
  local_48 = 5;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_48);
  local_48 = 1;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_48);
  return;
}

Assistant:

void compile_clock_constraint(tchecker::typed_expression_t const & first, tchecker::typed_expression_t const & second,
                                enum tchecker::ineq_cmp_t cmp, tchecker::typed_expression_t const & bound)
  {
    tchecker::details::lvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> clocks_compiler(_bytecode_back_inserter);

    first.visit(clocks_compiler);
    second.visit(clocks_compiler);
    bound.visit(*this);
    _bytecode_back_inserter = tchecker::VM_CLKCONSTR;
    _bytecode_back_inserter = cmp;
    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = 1;
  }